

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SoPlexBase(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  Statistics **p;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Statistics *this_03;
  Settings *newSettings;
  rational_type *prVar3;
  cpp_dec_float<100U,_int,_void> *pcVar4;
  cpp_dec_float<50U,_int,_void> *pcVar5;
  int i;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long lVar7;
  Tolerances *__tmp;
  SPxOut *this_04;
  longlong local_548;
  shared_ptr<soplex::Tolerances> local_540;
  shared_ptr<soplex::Tolerances> local_530;
  Rational *local_520;
  Rational *local_518;
  SolRational *local_510;
  SolRational *local_508;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_500;
  Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  *local_4f8;
  DSVectorRational *local_4f0;
  VectorRational *local_4e8;
  DSVectorRational *local_4e0;
  LPColSetRational *local_4d8;
  SLUFactorRational *local_4d0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4c8;
  Presol<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4c0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4b8;
  SPxSteepExPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4b0;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4a8;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4a0;
  SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_498;
  SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_490;
  SPxSteepExPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_488;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_480;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_478;
  SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_470;
  SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_468;
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_460;
  SPxSumST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_458;
  SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_450;
  Presol<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_448;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_440;
  shared_ptr<soplex::Tolerances> local_438;
  shared_ptr<soplex::Tolerances> local_428;
  element_type *local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  element_type *local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  element_type *local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  shared_ptr<soplex::Tolerances> local_3e8;
  element_type *local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d0;
  element_type *local_3c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  element_type *local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  shared_ptr<soplex::Tolerances> local_3a8;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined5 uStack_380;
  undefined3 uStack_37b;
  undefined5 local_378;
  undefined3 uStack_373;
  int local_370;
  bool local_36c;
  undefined8 local_368;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined5 uStack_340;
  undefined3 uStack_33b;
  undefined5 local_338;
  undefined3 uStack_333;
  int local_330;
  bool local_32c;
  undefined8 local_328;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined5 uStack_300;
  undefined3 uStack_2fb;
  undefined5 local_2f8;
  undefined3 uStack_2f3;
  int local_2f0;
  bool local_2ec;
  undefined8 local_2e8;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined5 uStack_2c0;
  undefined3 uStack_2bb;
  undefined5 local_2b8;
  undefined3 uStack_2b3;
  int local_2b0;
  bool local_2ac;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined5 uStack_280;
  undefined3 uStack_27b;
  undefined5 local_278;
  undefined3 uStack_273;
  int local_270;
  bool local_26c;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined5 uStack_240;
  undefined3 uStack_23b;
  undefined5 local_238;
  undefined3 uStack_233;
  int local_230;
  bool local_22c;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined5 uStack_1e0;
  undefined3 uStack_1db;
  int iStack_1d8;
  bool bStack_1d4;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined5 uStack_190;
  undefined3 uStack_18b;
  int iStack_188;
  bool bStack_184;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined5 uStack_140;
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  int iStack_e8;
  bool bStack_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  int iStack_98;
  bool bStack_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  this->_vptr_SoPlexBase = (_func_int **)&PTR__SoPlexBase_006b00a8;
  this_04 = &this->spxout;
  SPxOut::SPxOut(this_04);
  (this->_rationalPosInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_statistics = (Statistics *)0x0;
  this->_currentSettings = (Settings *)0x0;
  (this->_rationalPosInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalPosInfty).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalPosInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalPosInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalPosInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalPosInfty).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalPosInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalNegInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_rationalNegInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalNegInfty).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalNegInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalNegInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalNegInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalNegInfty).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalNegInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalFeastol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_rationalFeastol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalFeastol).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalFeastol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalFeastol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalFeastol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalFeastol).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalFeastol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalOpttol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_rationalOpttol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalOpttol).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalOpttol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalOpttol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalOpttol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalOpttol).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalOpttol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalMaxscaleincr).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_rationalMaxscaleincr).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalMaxscaleincr).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalMaxscaleincr).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalMaxscaleincr).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalMaxscaleincr).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalMaxscaleincr).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalMaxscaleincr).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  this_00 = &this->_solver;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSolverBase(this_00,LEAVE,ROW,USER_TIME);
  this_01 = &this->_slufactor;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SLUFactor(this_01);
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxMainSM(&this->_simplifierMainSM,USER_TIME);
  local_440 = &this->_simplifierMainSM;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSimplifier(&(this->_simplifierPaPILO).
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,"PaPILO",USER_TIME);
  (this->_simplifierPaPILO).
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxSimplifier = (_func_int **)&PTR__Presol_006b1b80;
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "uni-Equilibrium";
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = false;
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006b1c50;
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "bi-Equilibrium";
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006b1c50;
  local_40 = 0x1000000000;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4b = 0;
  iStack_48 = 0;
  bStack_44 = false;
  local_448 = &this->_simplifierPaPILO;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_88,0.85);
  local_90 = 0x1000000000;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_9b = 0;
  iStack_98 = 0;
  bStack_94 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_d8,1000.0);
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Geometric";
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006b1ff8;
  (this->_scalerGeo1).postequilibration = false;
  (this->_scalerGeo1).m_maxIterations = 1;
  *(undefined8 *)(this->_scalerGeo1).m_minImprovement.m_backend.data._M_elems = local_88;
  *(undefined8 *)((this->_scalerGeo1).m_minImprovement.m_backend.data._M_elems + 2) = uStack_80;
  *(undefined8 *)((this->_scalerGeo1).m_minImprovement.m_backend.data._M_elems + 4) = local_78;
  *(undefined8 *)((this->_scalerGeo1).m_minImprovement.m_backend.data._M_elems + 6) = uStack_70;
  *(undefined8 *)((this->_scalerGeo1).m_minImprovement.m_backend.data._M_elems + 8) = local_68;
  *(undefined8 *)((this->_scalerGeo1).m_minImprovement.m_backend.data._M_elems + 10) = uStack_60;
  *(undefined8 *)((this->_scalerGeo1).m_minImprovement.m_backend.data._M_elems + 0xc) = local_58;
  *(ulong *)((this->_scalerGeo1).m_minImprovement.m_backend.data._M_elems + 0xe) =
       CONCAT35(uStack_4b,uStack_50);
  (this->_scalerGeo1).m_minImprovement.m_backend.exp = iStack_48;
  (this->_scalerGeo1).m_minImprovement.m_backend.neg = bStack_44;
  (this->_scalerGeo1).m_minImprovement.m_backend.fpclass = (undefined4)local_40;
  (this->_scalerGeo1).m_minImprovement.m_backend.prec_elem = local_40._4_4_;
  *(undefined8 *)(this->_scalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems = local_d8;
  *(undefined8 *)((this->_scalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 2) = uStack_d0;
  *(undefined8 *)((this->_scalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 4) = local_c8;
  *(undefined8 *)((this->_scalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 6) = uStack_c0;
  *(undefined8 *)((this->_scalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 8) = local_b8;
  *(undefined8 *)((this->_scalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 10) = uStack_b0;
  *(undefined8 *)((this->_scalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 0xc) = local_a8;
  *(ulong *)((this->_scalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 0xe) =
       CONCAT35(uStack_9b,uStack_a0);
  (this->_scalerGeo1).m_goodEnoughRatio.m_backend.exp = iStack_98;
  (this->_scalerGeo1).m_goodEnoughRatio.m_backend.neg = bStack_94;
  (this->_scalerGeo1).m_goodEnoughRatio.m_backend.fpclass = (undefined4)local_90;
  (this->_scalerGeo1).m_goodEnoughRatio.m_backend.prec_elem = local_90._4_4_;
  local_e0 = 0x1000000000;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_eb = 0;
  iStack_e8 = 0;
  bStack_e4 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_128,0.85);
  local_130 = 0x1000000000;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_13b = 0;
  iStack_138 = 0;
  bStack_134 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_178,1000.0);
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Geometric";
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006b1ff8;
  (this->_scalerGeo8).postequilibration = false;
  (this->_scalerGeo8).m_maxIterations = 8;
  *(undefined8 *)(this->_scalerGeo8).m_minImprovement.m_backend.data._M_elems = local_128;
  *(undefined8 *)((this->_scalerGeo8).m_minImprovement.m_backend.data._M_elems + 2) = uStack_120;
  *(undefined8 *)((this->_scalerGeo8).m_minImprovement.m_backend.data._M_elems + 4) = local_118;
  *(undefined8 *)((this->_scalerGeo8).m_minImprovement.m_backend.data._M_elems + 6) = uStack_110;
  *(undefined8 *)((this->_scalerGeo8).m_minImprovement.m_backend.data._M_elems + 8) = local_108;
  *(undefined8 *)((this->_scalerGeo8).m_minImprovement.m_backend.data._M_elems + 10) = uStack_100;
  *(undefined8 *)((this->_scalerGeo8).m_minImprovement.m_backend.data._M_elems + 0xc) = local_f8;
  *(ulong *)((this->_scalerGeo8).m_minImprovement.m_backend.data._M_elems + 0xe) =
       CONCAT35(uStack_eb,uStack_f0);
  (this->_scalerGeo8).m_minImprovement.m_backend.exp = iStack_e8;
  (this->_scalerGeo8).m_minImprovement.m_backend.neg = bStack_e4;
  (this->_scalerGeo8).m_minImprovement.m_backend.fpclass = (undefined4)local_e0;
  (this->_scalerGeo8).m_minImprovement.m_backend.prec_elem = local_e0._4_4_;
  *(undefined8 *)(this->_scalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems = local_178;
  *(undefined8 *)((this->_scalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 2) = uStack_170;
  *(undefined8 *)((this->_scalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 4) = local_168;
  *(undefined8 *)((this->_scalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 6) = uStack_160;
  *(undefined8 *)((this->_scalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 8) = local_158;
  *(undefined8 *)((this->_scalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 10) = uStack_150;
  *(undefined8 *)((this->_scalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 0xc) = local_148;
  *(ulong *)((this->_scalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 0xe) =
       CONCAT35(uStack_13b,uStack_140);
  (this->_scalerGeo8).m_goodEnoughRatio.m_backend.exp = iStack_138;
  (this->_scalerGeo8).m_goodEnoughRatio.m_backend.neg = bStack_134;
  (this->_scalerGeo8).m_goodEnoughRatio.m_backend.fpclass = (undefined4)local_130;
  (this->_scalerGeo8).m_goodEnoughRatio.m_backend.prec_elem = local_130._4_4_;
  local_180 = 0x1000000000;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_18b = 0;
  iStack_188 = 0;
  bStack_184 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_1c8,0.85);
  local_1d0 = 0x1000000000;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1db = 0;
  iStack_1d8 = 0;
  bStack_1d4 = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_218,1000.0);
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Geometric";
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006b1ff8;
  (this->_scalerGeoequi).postequilibration = true;
  (this->_scalerGeoequi).m_maxIterations = 8;
  *(undefined8 *)(this->_scalerGeoequi).m_minImprovement.m_backend.data._M_elems = local_1c8;
  *(undefined8 *)((this->_scalerGeoequi).m_minImprovement.m_backend.data._M_elems + 2) = uStack_1c0;
  *(undefined8 *)((this->_scalerGeoequi).m_minImprovement.m_backend.data._M_elems + 4) = local_1b8;
  *(undefined8 *)((this->_scalerGeoequi).m_minImprovement.m_backend.data._M_elems + 6) = uStack_1b0;
  *(undefined8 *)((this->_scalerGeoequi).m_minImprovement.m_backend.data._M_elems + 8) = local_1a8;
  *(undefined8 *)((this->_scalerGeoequi).m_minImprovement.m_backend.data._M_elems + 10) = uStack_1a0
  ;
  *(undefined8 *)((this->_scalerGeoequi).m_minImprovement.m_backend.data._M_elems + 0xc) = local_198
  ;
  *(ulong *)((this->_scalerGeoequi).m_minImprovement.m_backend.data._M_elems + 0xe) =
       CONCAT35(uStack_18b,uStack_190);
  (this->_scalerGeoequi).m_minImprovement.m_backend.exp = iStack_188;
  (this->_scalerGeoequi).m_minImprovement.m_backend.neg = bStack_184;
  (this->_scalerGeoequi).m_minImprovement.m_backend.fpclass = (undefined4)local_180;
  (this->_scalerGeoequi).m_minImprovement.m_backend.prec_elem = local_180._4_4_;
  *(undefined8 *)(this->_scalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems = local_218;
  *(undefined8 *)((this->_scalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 2) = uStack_210
  ;
  *(undefined8 *)((this->_scalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 4) = local_208;
  *(undefined8 *)((this->_scalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 6) = uStack_200
  ;
  *(undefined8 *)((this->_scalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 8) = local_1f8;
  *(undefined8 *)((this->_scalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 10) =
       uStack_1f0;
  *(undefined8 *)((this->_scalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 0xc) =
       local_1e8;
  *(ulong *)((this->_scalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 0xe) =
       CONCAT35(uStack_1db,uStack_1e0);
  (this->_scalerGeoequi).m_goodEnoughRatio.m_backend.exp = iStack_1d8;
  (this->_scalerGeoequi).m_goodEnoughRatio.m_backend.neg = bStack_1d4;
  (this->_scalerGeoequi).m_goodEnoughRatio.m_backend.fpclass = (undefined4)local_1d0;
  (this->_scalerGeoequi).m_goodEnoughRatio.m_backend.prec_elem = local_1d0._4_4_;
  SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLeastSqSC(&this->_scalerLeastsq);
  SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxWeightST(&this->_starterWeight);
  local_458 = &this->_starterSum;
  local_450 = &this->_starterWeight;
  SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxWeightST((SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_458);
  (this->_starterSum).
  super_SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .state = NONE;
  (this->_starterSum).
  super_SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .vec.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->_starterSum).
           super_SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .vec.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->_starterSum).
           super_SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .vec.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->_starterSum).
  super_SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxStarter = (_func_int **)&PTR__SPxVectorST_006b2478;
  (this->_starterSum).
  super_SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Sum";
  local_460 = &this->_starterVector;
  SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxWeightST(&local_460->
                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
  (this->_starterVector).
  super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxStarter = (_func_int **)&PTR__SPxVectorST_006b2500;
  (this->_starterVector).state = NONE;
  (this->_starterVector).vec.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_starterVector).vec.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_starterVector).vec.val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_starterVector).
  super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "vector";
  local_468 = &this->_pricerAuto;
  SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxAutoPR(local_468);
  SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDantzigPR(&this->_pricerDantzig);
  local_470 = &this->_pricerParMult;
  SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxParMultPR(local_470);
  local_478 = &this->_pricerDevex;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDevexPR(local_478);
  local_480 = &this->_pricerQuickSteep;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepPR(local_480,"Steep",DEFAULT);
  local_488 = &this->_pricerSteep;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepPR(&local_488->
                super_SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,"SteepEx",EXACT);
  (this->_pricerSteep).
  super_SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxPricer = (_func_int **)&PTR_getName_006b27f0;
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006b2c10;
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Default";
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_type = LEAVE;
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.fpclass = cpp_dec_float_finite;
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.prec_elem = 0x10;
  pnVar1 = &(this->_ratiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar4 = &(this->_ratiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[2] = 0;
  (pcVar4->data)._M_elems[3] = 0;
  pcVar4 = &(this->_ratiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[4] = 0;
  (pcVar4->data)._M_elems[5] = 0;
  pcVar4 = &(this->_ratiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[6] = 0;
  (pcVar4->data)._M_elems[7] = 0;
  pcVar4 = &(this->_ratiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[8] = 0;
  (pcVar4->data)._M_elems[9] = 0;
  pcVar4 = &(this->_ratiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[10] = 0;
  (pcVar4->data)._M_elems[0xb] = 0;
  pcVar4 = &(this->_ratiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[0xc] = 0;
  (pcVar4->data)._M_elems[0xd] = 0;
  pcVar4 = &(this->_ratiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[0xe] = 0;
  (pcVar4->data)._M_elems[0xf] = 0;
  *(undefined8 *)
   ((long)(this->_ratiotesterTextbook).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x3d) = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)
             &(this->_ratiotesterTextbook).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .delta,1e-06);
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006b2b70;
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006b2c10;
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Harris";
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_type = LEAVE;
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.fpclass = cpp_dec_float_finite;
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.prec_elem = 0x10;
  pnVar1 = &(this->_ratiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar4 = &(this->_ratiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[2] = 0;
  (pcVar4->data)._M_elems[3] = 0;
  pcVar4 = &(this->_ratiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[4] = 0;
  (pcVar4->data)._M_elems[5] = 0;
  pcVar4 = &(this->_ratiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[6] = 0;
  (pcVar4->data)._M_elems[7] = 0;
  pcVar4 = &(this->_ratiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[8] = 0;
  (pcVar4->data)._M_elems[9] = 0;
  pcVar4 = &(this->_ratiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[10] = 0;
  (pcVar4->data)._M_elems[0xb] = 0;
  pcVar4 = &(this->_ratiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[0xc] = 0;
  (pcVar4->data)._M_elems[0xd] = 0;
  pcVar4 = &(this->_ratiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[0xe] = 0;
  (pcVar4->data)._M_elems[0xf] = 0;
  *(undefined8 *)
   ((long)(this->_ratiotesterHarris).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x3d) = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)
             &(this->_ratiotesterHarris).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .delta,1e-06);
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006b2c88;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxFastRT(&this->_ratiotesterFast);
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxBoundFlippingRT(&this->_ratiotesterBoundFlipping);
  this->_simplifier =
       (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->_scaler =
       (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->_starter =
       (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSolverBase(&this->_boostedSolver,LEAVE,ROW,USER_TIME);
  this->_initialPrecision = 0x32;
  this->_tolPrecisionRatio = 0.65;
  this->_epsZeroPrecisionRatio = 1.0;
  this->_epsFactorPrecisionRatio = 1.25;
  this->_epsUpdatePrecisionRatio = 1.0;
  this->_epsPivotPrecisionRatio = 0.625;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SLUFactor(&this->_boostedSlufactor);
  SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxAutoPR(&this->_boostedPricerAuto);
  local_490 = &this->_boostedPricerAuto;
  SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDantzigPR(&this->_boostedPricerDantzig);
  local_498 = &this->_boostedPricerParMult;
  SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxParMultPR(local_498);
  local_4a0 = &this->_boostedPricerDevex;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDevexPR(local_4a0);
  local_4a8 = &this->_boostedPricerQuickSteep;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepPR(local_4a8,"Steep",DEFAULT);
  local_4b0 = &this->_boostedPricerSteep;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepPR(&local_4b0->
                super_SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,"SteepEx",EXACT);
  (this->_boostedPricerSteep).
  super_SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxPricer = (_func_int **)&PTR_getName_006ae190;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006ae5b0;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Default";
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_type = LEAVE;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.fpclass = cpp_dec_float_finite;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.prec_elem = 10;
  pnVar2 = &(this->_boostedRatiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta;
  (pnVar2->m_backend).data._M_elems[0] = 0;
  (pnVar2->m_backend).data._M_elems[1] = 0;
  pcVar5 = &(this->_boostedRatiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar5->data)._M_elems[2] = 0;
  (pcVar5->data)._M_elems[3] = 0;
  pcVar5 = &(this->_boostedRatiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar5->data)._M_elems[4] = 0;
  (pcVar5->data)._M_elems[5] = 0;
  pcVar5 = &(this->_boostedRatiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar5->data)._M_elems[6] = 0;
  (pcVar5->data)._M_elems[7] = 0;
  *(undefined8 *)
   ((long)(this->_boostedRatiotesterTextbook).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)
   ((long)(this->_boostedRatiotesterTextbook).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             &(this->_boostedRatiotesterTextbook).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .delta,1e-06);
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006ae510;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006ae5b0;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Harris";
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_type = LEAVE;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.fpclass = cpp_dec_float_finite;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.prec_elem = 10;
  pnVar2 = &(this->_boostedRatiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta;
  (pnVar2->m_backend).data._M_elems[0] = 0;
  (pnVar2->m_backend).data._M_elems[1] = 0;
  pcVar5 = &(this->_boostedRatiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar5->data)._M_elems[2] = 0;
  (pcVar5->data)._M_elems[3] = 0;
  pcVar5 = &(this->_boostedRatiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar5->data)._M_elems[4] = 0;
  (pcVar5->data)._M_elems[5] = 0;
  pcVar5 = &(this->_boostedRatiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar5->data)._M_elems[6] = 0;
  (pcVar5->data)._M_elems[7] = 0;
  *(undefined8 *)
   ((long)(this->_boostedRatiotesterHarris).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)
   ((long)(this->_boostedRatiotesterHarris).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             &(this->_boostedRatiotesterHarris).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .delta,1e-06);
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006ae628;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxFastRT(&this->_boostedRatiotesterFast);
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxBoundFlippingRT(&this->_boostedRatiotesterBoundFlipping);
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "bi-Equilibrium";
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006ae7d8;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "bi-Equilibrium";
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006ae7d8;
  local_228 = 0xa00000000;
  local_258 = 0;
  uStack_250 = 0;
  local_248 = 0;
  uStack_240 = 0;
  uStack_23b = 0;
  local_238 = 0;
  uStack_233 = 0;
  local_230 = 0;
  local_22c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_258,0.85);
  local_268 = 0xa00000000;
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0;
  uStack_280 = 0;
  uStack_27b = 0;
  local_278 = 0;
  uStack_273 = 0;
  local_270 = 0;
  local_26c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_298,1000.0);
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Geometric";
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006aeb80;
  (this->_boostedScalerGeo1).postequilibration = false;
  (this->_boostedScalerGeo1).m_maxIterations = 8;
  *(undefined8 *)(this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems = local_258;
  *(undefined8 *)((this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems + 2) =
       uStack_250;
  *(undefined8 *)((this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems + 4) =
       local_248;
  *(ulong *)((this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_23b,uStack_240);
  *(ulong *)((this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_233,local_238);
  (this->_boostedScalerGeo1).m_minImprovement.m_backend.exp = local_230;
  (this->_boostedScalerGeo1).m_minImprovement.m_backend.neg = local_22c;
  (this->_boostedScalerGeo1).m_minImprovement.m_backend.fpclass = (undefined4)local_228;
  (this->_boostedScalerGeo1).m_minImprovement.m_backend.prec_elem = local_228._4_4_;
  *(undefined8 *)(this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems = local_298;
  *(undefined8 *)((this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 2) =
       uStack_290;
  *(undefined8 *)((this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 4) =
       local_288;
  *(ulong *)((this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_27b,uStack_280);
  *(ulong *)((this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_273,local_278);
  (this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.exp = local_270;
  (this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.neg = local_26c;
  (this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.fpclass = (undefined4)local_268;
  (this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.prec_elem = local_268._4_4_;
  local_2a8 = 0xa00000000;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  uStack_2bb = 0;
  local_2b8 = 0;
  uStack_2b3 = 0;
  local_2b0 = 0;
  local_2ac = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_2d8,0.85);
  local_2e8 = 0xa00000000;
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  uStack_300 = 0;
  uStack_2fb = 0;
  local_2f8 = 0;
  uStack_2f3 = 0;
  local_2f0 = 0;
  local_2ec = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_318,1000.0);
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Geometric";
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006aeb80;
  (this->_boostedScalerGeo8).postequilibration = false;
  (this->_boostedScalerGeo8).m_maxIterations = 8;
  *(undefined8 *)(this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems = local_2d8;
  *(undefined8 *)((this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems + 2) =
       uStack_2d0;
  *(undefined8 *)((this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems + 4) =
       local_2c8;
  *(ulong *)((this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_2bb,uStack_2c0);
  *(ulong *)((this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_2b3,local_2b8);
  (this->_boostedScalerGeo8).m_minImprovement.m_backend.exp = local_2b0;
  (this->_boostedScalerGeo8).m_minImprovement.m_backend.neg = local_2ac;
  (this->_boostedScalerGeo8).m_minImprovement.m_backend.fpclass = (undefined4)local_2a8;
  (this->_boostedScalerGeo8).m_minImprovement.m_backend.prec_elem = local_2a8._4_4_;
  *(undefined8 *)(this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems = local_318;
  *(undefined8 *)((this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 2) =
       uStack_310;
  *(undefined8 *)((this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 4) =
       local_308;
  *(ulong *)((this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_2fb,uStack_300);
  *(ulong *)((this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_2f3,local_2f8);
  (this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.exp = local_2f0;
  (this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.neg = local_2ec;
  (this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.fpclass = (undefined4)local_2e8;
  (this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.prec_elem = local_2e8._4_4_;
  local_328 = 0xa00000000;
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  uStack_340 = 0;
  uStack_33b = 0;
  local_338 = 0;
  uStack_333 = 0;
  local_330 = 0;
  local_32c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_358,0.85);
  local_368 = 0xa00000000;
  local_398 = 0;
  uStack_390 = 0;
  local_388 = 0;
  uStack_380 = 0;
  uStack_37b = 0;
  local_378 = 0;
  uStack_373 = 0;
  local_370 = 0;
  local_36c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_398,1000.0);
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Geometric";
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006aeb80;
  (this->_boostedScalerGeoequi).postequilibration = false;
  (this->_boostedScalerGeoequi).m_maxIterations = 8;
  *(undefined8 *)(this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems = local_358;
  *(undefined8 *)((this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems + 2) =
       uStack_350;
  *(undefined8 *)((this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems + 4) =
       local_348;
  *(ulong *)((this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_33b,uStack_340);
  *(ulong *)((this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_333,local_338);
  (this->_boostedScalerGeoequi).m_minImprovement.m_backend.exp = local_330;
  (this->_boostedScalerGeoequi).m_minImprovement.m_backend.neg = local_32c;
  (this->_boostedScalerGeoequi).m_minImprovement.m_backend.fpclass = (undefined4)local_328;
  (this->_boostedScalerGeoequi).m_minImprovement.m_backend.prec_elem = local_328._4_4_;
  *(undefined8 *)(this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems = local_398
  ;
  *(undefined8 *)((this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 2) =
       uStack_390;
  *(undefined8 *)((this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 4) =
       local_388;
  *(ulong *)((this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_37b,uStack_380);
  *(ulong *)((this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_373,local_378);
  (this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.exp = local_370;
  (this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.neg = local_36c;
  (this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.fpclass = (undefined4)local_368;
  (this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.prec_elem = local_368._4_4_;
  SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLeastSqSC(&this->_boostedScalerLeastsq);
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxMainSM(&this->_boostedSimplifierMainSM,USER_TIME);
  local_4b8 = &this->_boostedSimplifierMainSM;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSimplifier(&(this->_boostedSimplifierPaPILO).
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,"PaPILO",USER_TIME);
  (this->_boostedSimplifierPaPILO).
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxSimplifier = (_func_int **)&PTR__Presol_006afca8;
  (this->_manualLower).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualLower).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualLower).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_manualUpper).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualUpper).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualUpper).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_manualLhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualLhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualLhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_manualRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_manualObj).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualObj).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualObj).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c0 = &this->_boostedSimplifierPaPILO;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLPBase(&this->_manualRealLP);
  this->_rationalLP = (SPxLPRational *)0x0;
  local_4d0 = &this->_rationalLUSolver;
  local_4c8 = &this->_manualRealLP;
  SLUFactorRational::SLUFactorRational(local_4d0);
  (this->_rationalLUSolverBind).data = (int *)0x0;
  (this->_rationalLUSolverBind).memFactor = 1.2;
  (this->_rationalLUSolverBind).thesize = 0;
  (this->_rationalLUSolverBind).themax = 1;
  spx_alloc<int*>(&(this->_rationalLUSolverBind).data,1);
  local_4d8 = &this->_slackCols;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColSetBase(local_4d8,-1,-1);
  local_4e0 = &this->_tauColVector;
  (this->_tauColVector).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)0x0;
  (this->_tauColVector).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memsize = 0;
  (this->_tauColVector).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memused = 0;
  (this->_unboundedLower).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unboundedLower).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_unboundedLower).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_unboundedUpper).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unboundedUpper).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_unboundedUpper).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_unboundedLhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unboundedLhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_unboundedLhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_unboundedRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unboundedRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_unboundedRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_tauColVector)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a9f50;
  (this->_tauColVector).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::allocMem(local_4e0,8);
  local_4e8 = &this->_feasObj;
  (this->_primalDualDiff).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)0x0;
  (this->_primalDualDiff).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memsize = 0;
  (this->_primalDualDiff).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memused = 0;
  memset(local_4e8,0,0xf0);
  (this->_primalDualDiff)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a9f50;
  (this->_primalDualDiff).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        *)0x0;
  local_4f0 = &this->_primalDualDiff;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::allocMem(&this->_primalDualDiff,8);
  (this->_storedBasisStatusRows).data = (VarStatus *)0x0;
  (this->_storedBasisStatusRows).memFactor = 1.2;
  (this->_storedBasisStatusRows).thesize = 0;
  (this->_storedBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_storedBasisStatusRows).data,1);
  (this->_storedBasisStatusCols).data = (VarStatus *)0x0;
  (this->_storedBasisStatusCols).memFactor = 1.2;
  (this->_storedBasisStatusCols).thesize = 0;
  (this->_storedBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_storedBasisStatusCols).data,1);
  Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  ::Array(&this->_unitMatrixRational,0);
  (this->_colTypes).data = (RangeType *)0x0;
  (this->_colTypes).memFactor = 1.2;
  (this->_colTypes).thesize = 0;
  (this->_colTypes).themax = 1;
  local_4f8 = &this->_unitMatrixRational;
  spx_alloc<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::RangeType*>
            (&(this->_colTypes).data,1);
  (this->_rowTypes).data = (RangeType *)0x0;
  (this->_rowTypes).memFactor = 1.2;
  (this->_rowTypes).thesize = 0;
  (this->_rowTypes).themax = 1;
  spx_alloc<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::RangeType*>
            (&(this->_rowTypes).data,1);
  this->_status = UNKNOWN;
  (this->_basisStatusRows).data = (VarStatus *)0x0;
  (this->_basisStatusRows).memFactor = 1.2;
  (this->_basisStatusRows).thesize = 0;
  (this->_basisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_basisStatusRows).data,1);
  (this->_basisStatusCols).data = (VarStatus *)0x0;
  (this->_basisStatusCols).memFactor = 1.2;
  (this->_basisStatusCols).thesize = 0;
  (this->_basisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_basisStatusCols).data,1);
  (this->_oldBasisStatusRows).data = (VarStatus *)0x0;
  (this->_oldBasisStatusRows).memFactor = 1.2;
  (this->_oldBasisStatusRows).thesize = 0;
  (this->_oldBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_oldBasisStatusRows).data,1);
  (this->_oldBasisStatusCols).data = (VarStatus *)0x0;
  (this->_oldBasisStatusCols).memFactor = 1.2;
  (this->_oldBasisStatusCols).thesize = 0;
  (this->_oldBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_oldBasisStatusCols).data,1);
  (this->_oldFeasBasisStatusRows).data = (VarStatus *)0x0;
  (this->_oldFeasBasisStatusRows).memFactor = 1.2;
  (this->_oldFeasBasisStatusRows).thesize = 0;
  (this->_oldFeasBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_oldFeasBasisStatusRows).data,1);
  (this->_oldFeasBasisStatusCols).data = (VarStatus *)0x0;
  (this->_oldFeasBasisStatusCols).memFactor = 1.2;
  (this->_oldFeasBasisStatusCols).thesize = 0;
  (this->_oldFeasBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_oldFeasBasisStatusCols).data,1);
  (this->_oldUnbdBasisStatusRows).data = (VarStatus *)0x0;
  (this->_oldUnbdBasisStatusRows).memFactor = 1.2;
  (this->_oldUnbdBasisStatusRows).thesize = 0;
  (this->_oldUnbdBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_oldUnbdBasisStatusRows).data,1);
  (this->_oldUnbdBasisStatusCols).data = (VarStatus *)0x0;
  (this->_oldUnbdBasisStatusCols).memFactor = 1.2;
  (this->_oldUnbdBasisStatusCols).thesize = 0;
  (this->_oldUnbdBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_oldUnbdBasisStatusCols).data,1);
  (this->_tmpBasisStatusRows).data = (VarStatus *)0x0;
  (this->_tmpBasisStatusRows).memFactor = 1.2;
  (this->_tmpBasisStatusRows).thesize = 0;
  (this->_tmpBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_tmpBasisStatusRows).data,1);
  (this->_tmpBasisStatusCols).data = (VarStatus *)0x0;
  (this->_tmpBasisStatusCols).memFactor = 1.2;
  (this->_tmpBasisStatusCols).thesize = 0;
  (this->_tmpBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (&(this->_tmpBasisStatusCols).data,1);
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SolBase(&this->_solReal);
  local_500 = &this->_solReal;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SolBase(&this->_solRational);
  local_508 = &this->_solRational;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SolBase(&this->_workSol);
  this->_hasBasis = false;
  this->_hasSolReal = false;
  this->_hasSolRational = false;
  local_518 = &this->_rationalPosone;
  local_548 = 1;
  local_510 = &this->_workSol;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>(&local_518->m_backend,&local_548,(type *)0x0);
  local_520 = &this->_rationalNegone;
  local_548 = -1;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>(&local_520->m_backend,&local_548,(type *)0x0);
  local_548 = 0;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>(&(this->_rationalZero).m_backend,&local_548,(type *)0x0);
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_006afd78;
  p_Var6[1]._vptr__Sp_counted_base = (_func_int **)0x3c9cd2b297d889bc;
  p_Var6[1]._M_use_count = 0xc924223;
  p_Var6[1]._M_weak_count = 0x3bc79ca1;
  p_Var6[2]._vptr__Sp_counted_base = (_func_int **)0x3c9cd2b297d889bc;
  p_Var6[2]._M_use_count = -0x26284245;
  p_Var6[2]._M_weak_count = 0x3ddb7cdf;
  p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x3eb0c6f7a0b5ed8d;
  p_Var6[3]._M_use_count = -0x5f4a1273;
  p_Var6[3]._M_weak_count = 0x3eb0c6f7;
  p_Var6[4]._vptr__Sp_counted_base = (_func_int **)0x3eb0c6f7a0b5ed8d;
  p_Var6[4]._M_use_count = -0x5f4a1273;
  p_Var6[4]._M_weak_count = 0x3eb0c6f7;
  p_Var6[5]._vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var6 + 1);
  this_02 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var6;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  local_530.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_530.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_530.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_530.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_530.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_530.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_530.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(this_00,&local_530);
  if (local_530.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_540.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_540.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_540.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_540.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_540.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_540.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_540.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(&this->_boostedSolver,&local_540);
  __r = &(this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount;
  if (local_540.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_540.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerUniequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerBiequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerGeo1).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerGeo8).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerGeoequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_scalerLeastsq).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerLeastsq).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerUniequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerBiequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerGeo1).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerGeo8).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerGeoequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerLeastsq).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerLeastsq).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(&this->_ratiotesterBoundFlipping,&local_3a8);
  if (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_3b8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_3b0._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3b0._M_pi)->_M_use_count = (local_3b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3b0._M_pi)->_M_use_count = (local_3b0._M_pi)->_M_use_count + 1;
    }
  }
  (this->_ratiotesterFast).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3b8
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_ratiotesterFast).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_3b0);
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  local_3c8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_3c0._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3c0._M_pi)->_M_use_count = (local_3c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3c0._M_pi)->_M_use_count = (local_3c0._M_pi)->_M_use_count + 1;
    }
  }
  (this->_ratiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3c8
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_ratiotesterHarris).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_3c0);
  if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0._M_pi);
  }
  local_3d8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_3d0._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
    }
  }
  (this->_ratiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3d8
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_ratiotesterTextbook).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_3d0);
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d0._M_pi);
  }
  local_3e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_3e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_3e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(&this->_boostedRatiotesterBoundFlipping,&local_3e8);
  if (local_3e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_3f8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_3f0._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3f0._M_pi)->_M_use_count = (local_3f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3f0._M_pi)->_M_use_count = (local_3f0._M_pi)->_M_use_count + 1;
    }
  }
  (this->_boostedRatiotesterFast).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3f8
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedRatiotesterFast).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_3f0);
  if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
  }
  local_408 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_400._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
    }
  }
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_408
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedRatiotesterHarris).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_400);
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
  }
  local_418 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_410._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
    }
  }
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_418
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedRatiotesterTextbook).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_410);
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
  }
  local_428.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_428.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_428.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_428.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_428.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_428.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_428.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(this_01,&local_428);
  if (local_428.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_428.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(&this->_boostedSlufactor,&local_438);
  if (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_438.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->_solver).spxout = this_04;
  (this->_solver).
  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  (this->_scalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  (this->_scalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  (this->_scalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  (this->_scalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  (this->_scalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  (this->_scalerLeastsq).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  (this->_slufactor).
  super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::loadBasisSolver(&(this->_solver).
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,&this_01->
                      super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,false);
  p = &this->_statistics;
  this->_realLP =
       &this_00->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  this->_isRealLPLoaded = true;
  this->_isRealLPScaled = false;
  this->_applyPolishing = false;
  this->_optimizeCalls = 0;
  this->_unscaleCalls = 0;
  (this->_solver).
  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  spx_alloc<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Statistics*>
            (p,1);
  this_03 = *p;
  Statistics::Statistics(this_03,USER_TIME);
  *p = this_03;
  spx_alloc<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Settings*>
            (&this->_currentSettings,1);
  newSettings = this->_currentSettings;
  lVar7 = 0;
  do {
    newSettings->_boolParamValues[lVar7] = (bool)(&DAT_006b9e48)[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1a);
  lVar7 = 0;
  do {
    newSettings->_intParamValues[lVar7] = (&DAT_006ba570)[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1c);
  lVar7 = 0;
  do {
    newSettings->_realParamValues[lVar7] = (Real)(&DAT_006bad88)[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1b);
  setSettings(this,newSettings,true);
  this->_lastSolveMode = this->_currentSettings->_intParamValues[0x11];
  (this->_simplifierPaPILO).
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = this_04;
  return;
}

Assistant:

SoPlexBase<R>::SoPlexBase()
   : _statistics(nullptr)
   , _currentSettings(nullptr)
   , _scalerUniequi(false)
   , _scalerBiequi(true)
   , _scalerGeo1(false, 1)
   , _scalerGeo8(false, 8)
   , _scalerGeoequi(true)
   , _scalerLeastsq()
   , _simplifier(nullptr)
   , _scaler(nullptr)
   , _starter(nullptr)
   , _rationalLP(nullptr)
   , _unitMatrixRational(0)
   , _status(SPxSolverBase<R>::UNKNOWN)
   , _hasBasis(false)
   , _hasSolReal(false)
   , _hasSolRational(false)
   , _rationalPosone(1)
   , _rationalNegone(-1)
   , _rationalZero(0)
{
   _tolerances = std::make_shared<Tolerances>();
   _solver.setTolerances(_tolerances);
   _boostedSolver.setTolerances(_tolerances);
   // set tolerances for scalers
   _scalerUniequi.setTolerances(_tolerances);
   _scalerBiequi.setTolerances(_tolerances);
   _scalerGeo1.setTolerances(_tolerances);
   _scalerGeo8.setTolerances(_tolerances);
   _scalerGeoequi.setTolerances(_tolerances);
   _scalerLeastsq.setTolerances(_tolerances);

   _boostedScalerUniequi.setTolerances(_tolerances);
   _boostedScalerBiequi.setTolerances(_tolerances);
   _boostedScalerGeo1.setTolerances(_tolerances);
   _boostedScalerGeo8.setTolerances(_tolerances);
   _boostedScalerGeoequi.setTolerances(_tolerances);
   _boostedScalerLeastsq.setTolerances(_tolerances);

   // set tolerances for ratio testers
   _ratiotesterBoundFlipping.setTolerances(_tolerances);
   _ratiotesterFast.setTolerances(_tolerances);
   _ratiotesterHarris.setTolerances(_tolerances);
   _ratiotesterTextbook.setTolerances(_tolerances);

   _boostedRatiotesterBoundFlipping.setTolerances(_tolerances);
   _boostedRatiotesterFast.setTolerances(_tolerances);
   _boostedRatiotesterHarris.setTolerances(_tolerances);
   _boostedRatiotesterTextbook.setTolerances(_tolerances);

   // set tolerances for slufactor
   _slufactor.setTolerances(_tolerances);
   _boostedSlufactor.setTolerances(_tolerances);
   // transfer message handler
   _solver.setOutstream(spxout);
   _scalerUniequi.setOutstream(spxout);
   _scalerBiequi.setOutstream(spxout);
   _scalerGeo1.setOutstream(spxout);
   _scalerGeo8.setOutstream(spxout);
   _scalerGeoequi.setOutstream(spxout);
   _scalerLeastsq.setOutstream(spxout);

   // give lu factorization to solver
   _solver.setBasisSolver(&_slufactor);

#ifdef SOPLEX_WITH_MPFR
   // set initial precision
   BP::default_precision(_initialPrecision);

   _boostedSolver.setOutstream(spxout);
   _boostedScalerUniequi.setOutstream(spxout);
   _boostedScalerBiequi.setOutstream(spxout);
   _boostedScalerGeo1.setOutstream(spxout);
   _boostedScalerGeo8.setOutstream(spxout);
   _boostedScalerGeoequi.setOutstream(spxout);
   _boostedScalerLeastsq.setOutstream(spxout);

   _boostedSolver.setBasisSolver(&_boostedSlufactor);

   _lastStallPrecBoosts = 0;
   _factorSolNewBasisPrecBoost = true;
   _nextRatrecPrecBoost = 0;
   _prevIterations = 0;

   _switchedToBoosted = false;

   _certificateMode = 0;
   _hasOldBasis     = false;
   _hasOldFeasBasis = false;
   _hasOldUnbdBasis = false;

   _boostingLimitReached = false;
#endif

   // the R LP is initially stored in the solver; the rational LP is constructed, when the parameter SYNCMODE is
   // initialized in setSettings() below
   _realLP = &_solver;
   _isRealLPLoaded = true;
   _isRealLPScaled = false;
   _applyPolishing = false;
   _optimizeCalls = 0;
   _unscaleCalls = 0;
   _realLP->setOutstream(spxout);

   // initialize statistics
   spx_alloc(_statistics);
   _statistics = new(_statistics) Statistics();

   // initialize parameter settings to default
   spx_alloc(_currentSettings);
   _currentSettings = new(_currentSettings) Settings();
   setSettings(*_currentSettings, true);

   _lastSolveMode = intParam(SoPlexBase<R>::SOLVEMODE);

   _simplifierPaPILO.setOutstream(spxout);

   assert(_isConsistent());
}